

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goesproc.cc
# Opt level: O2

int main(int argc,char **argv)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  GOESRImageHandler *this;
  EMWINHandler *this_00;
  NWSTextHandler *this_01;
  TextHandler *this_02;
  NWSImageHandler *this_03;
  Himawari8ImageHandler *this_04;
  GOESNImageHandler *this_05;
  ostream *poVar4;
  pointer config_00;
  shared_ptr<FileWriter> fileWriter;
  undefined1 local_1f0 [8];
  undefined1 local_1e8 [12];
  int argc_local;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  handlers;
  PacketProcessor p;
  char **argv_local;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  local_168;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  local_148;
  Options opts;
  Config config;
  
  argc_local = argc;
  argv_local = argv;
  setenv("TZ","",1);
  parseOptions(&opts,&argc_local,&argv_local);
  Config::load(&config,&opts.config);
  if (config.ok == false) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Invalid configuration: ");
    poVar4 = std::operator<<(poVar4,(string *)&config.error);
    std::endl<char,std::char_traits<char>>(poVar4);
LAB_00179858:
    exit(1);
  }
  util::mkdirp(&opts.out);
  std::make_shared<FileWriter,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileWriter);
  if (opts.force == true) {
    (fileWriter.super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->force_ = true;
  }
  handlers.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  handlers.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  handlers.
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  config_00 = config.handlers.super__Vector_base<Config::Handler,_std::allocator<Config::Handler>_>.
              _M_impl.super__Vector_impl_data._M_start;
LAB_001793c6:
  if (config_00 ==
      config.handlers.super__Vector_base<Config::Handler,_std::allocator<Config::Handler>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (opts.mode == PACKET) {
      local_168.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           handlers.
           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_168.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           handlers.
           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_168.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           handlers.
           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      handlers.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      handlers.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      handlers.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      PacketProcessor::PacketProcessor(&p,&local_168);
      std::
      vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ::~vector(&local_168);
      if (opts.subscribe._M_string_length == 0) {
        std::
        make_unique<FileReader,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1e8);
      }
      else {
        std::make_unique<NanomsgReader,std::__cxx11::string&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
      }
      local_1f0 = (undefined1  [8])local_1e8._0_8_;
      iVar3 = fileno(_stdout);
      iVar3 = isatty(iVar3);
      PacketProcessor::run
                (&p,(unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *)local_1f0,
                 iVar3 != 0);
      if (local_1f0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1f0 + 8))();
      }
      PacketProcessor::~PacketProcessor(&p);
    }
    if (opts.mode == LRIT) {
      local_148.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           handlers.
           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_148.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           handlers.
           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_148.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           handlers.
           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      handlers.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      handlers.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      handlers.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      LRITProcessor::LRITProcessor((LRITProcessor *)&p,&local_148);
      std::
      vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ::~vector(&local_148);
      LRITProcessor::run((LRITProcessor *)&p,argc_local,argv_local);
      std::
      vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ::~vector(&p.handlers_);
    }
    std::
    vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
    ::~vector(&handlers);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&fileWriter.super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Config::~Config(&config);
    Options::~Options(&opts);
    return 0;
  }
  bVar2 = std::operator==(&config_00->type,"image");
  if (bVar2) {
    psVar1 = &config_00->origin;
    bVar2 = std::operator==(psVar1,"goes16");
    if (!bVar2) {
      bVar2 = std::operator==(psVar1,"goes17");
      if (!bVar2) {
        bVar2 = std::operator==(psVar1,"goes18");
        if (!bVar2) {
          bVar2 = std::operator==(psVar1,"goes19");
          if (!bVar2) {
            bVar2 = std::operator==(psVar1,"nws");
            if (bVar2) {
              this_03 = (NWSImageHandler *)operator_new(0x1f8);
              NWSImageHandler::NWSImageHandler(this_03,config_00,&fileWriter);
              p.handlers_.
              super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)this_03;
              std::
              vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
              ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
                        ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
                          *)&handlers,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&p);
              goto LAB_001794a5;
            }
            bVar2 = std::operator==(psVar1,"himawari8");
            if (bVar2) {
              this_04 = (Himawari8ImageHandler *)operator_new(0x250);
              Himawari8ImageHandler::Himawari8ImageHandler(this_04,config_00,&fileWriter);
              p.handlers_.
              super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)this_04;
              std::
              vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
              ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
                        ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
                          *)&handlers,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&p);
            }
            else {
              bVar2 = std::operator==(psVar1,"goes13");
              if (!bVar2) {
                bVar2 = std::operator==(psVar1,"goes15");
                if (!bVar2) {
                  poVar4 = std::operator<<((ostream *)&std::cerr,"Invalid image handler origin: ");
                  poVar4 = std::operator<<(poVar4,(string *)psVar1);
                  std::endl<char,std::char_traits<char>>(poVar4);
                  goto LAB_00179858;
                }
              }
              this_05 = (GOESNImageHandler *)operator_new(600);
              GOESNImageHandler::GOESNImageHandler(this_05,config_00,&fileWriter);
              p.handlers_.
              super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)this_05;
              std::
              vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
              ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
                        ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
                          *)&handlers,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&p);
            }
            goto LAB_001794a5;
          }
        }
      }
    }
    this = (GOESRImageHandler *)operator_new(0x290);
    GOESRImageHandler::GOESRImageHandler(this,config_00,&fileWriter);
    p.handlers_.
    super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
    std::
    vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
    ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
              ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
                *)&handlers,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&p);
  }
  else {
    bVar2 = std::operator==(&config_00->type,"emwin");
    if (bVar2) {
      this_00 = (EMWINHandler *)operator_new(0x1f8);
      EMWINHandler::EMWINHandler(this_00,config_00,&fileWriter);
      p.handlers_.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
      std::
      vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
      ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
                ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
                  *)&handlers,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&p);
      goto LAB_001794a5;
    }
    bVar2 = std::operator==(&config_00->type,"dcs");
    if (bVar2) goto LAB_001794ad;
    bVar2 = std::operator==(&config_00->type,"text");
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Invalid handler type: ");
      poVar4 = std::operator<<(poVar4,(string *)config_00);
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_00179858;
    }
    psVar1 = &config_00->origin;
    bVar2 = std::operator==(psVar1,"nws");
    if (bVar2) {
      this_01 = (NWSTextHandler *)operator_new(0x1f8);
      NWSTextHandler::NWSTextHandler(this_01,config_00,&fileWriter);
      p.handlers_.
      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this_01;
      std::
      vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
      ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
                ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
                  *)&handlers,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&p);
      goto LAB_001794a5;
    }
    bVar2 = std::operator==(psVar1,"other");
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Invalid text handler product: ");
      poVar4 = std::operator<<(poVar4,(string *)psVar1);
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_00179858;
    }
    this_02 = (TextHandler *)operator_new(0x1f8);
    TextHandler::TextHandler(this_02,config_00,&fileWriter);
    p.handlers_.
    super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this_02;
    std::
    vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
    ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
              ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
                *)&handlers,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&p);
  }
LAB_001794a5:
  std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)&p);
LAB_001794ad:
  config_00 = config_00 + 1;
  goto LAB_001793c6;
}

Assistant:

int main(int argc, char** argv) {
  // Dealing with time zones is a PITA even if you only care about UTC.
  // Since this is not a library we can get away with the following...
  setenv("TZ", "", 1);

  auto opts = parseOptions(argc, argv);
  auto config = Config::load(opts.config);
  if (!config.ok) {
    std::cerr << "Invalid configuration: " << config.error << std::endl;
    exit(1);
  }

  // Make sure output directory exists
  mkdirp(opts.out);

  // Handlers share a file writer instance
  auto fileWriter = std::make_shared<FileWriter>(opts.out);
  if (opts.force) {
    fileWriter->setForce(true);
  }

  // Construct list of file handlers
  std::vector<std::unique_ptr<Handler> > handlers;
  for (const auto& handler: config.handlers) {
    if (handler.type == "image") {
      const auto& origin = handler.origin;
      if (origin == "goes16" || origin == "goes17" || origin == "goes18" || origin == "goes19") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new GOESRImageHandler(handler, fileWriter)));
        continue;
      }

      if (origin == "nws") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new NWSImageHandler(handler, fileWriter)));
        continue;
      }

      if (origin == "himawari8") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new Himawari8ImageHandler(handler, fileWriter)));
        continue;
      }

      if (origin == "goes13" || origin == "goes15") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new GOESNImageHandler(handler, fileWriter)));
        continue;
      }

      std::cerr << "Invalid image handler origin: " << handler.origin << std::endl;
      exit(1);
    } else if (handler.type == "emwin") {
      handlers.push_back(
        std::unique_ptr<Handler>(
          new EMWINHandler(handler, fileWriter)));
    } else if (handler.type == "dcs") {
      // TODO
    } else if (handler.type == "text") {
      const auto& origin = handler.origin;
      if (origin == "nws") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new NWSTextHandler(handler, fileWriter)));
        continue;
      }

      if (origin == "other") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new TextHandler(handler, fileWriter)));
        continue;
      }

      std::cerr << "Invalid text handler product: " << handler.origin << std::endl;
      exit(1);
    } else {
      std::cerr << "Invalid handler type: " << handler.type << std::endl;
      exit(1);
    }
  }

  if (opts.mode == ProcessMode::PACKET) {
    PacketProcessor p(std::move(handlers));
    std::unique_ptr<PacketReader> reader;

    // Either use subscriber or read packets from files
    if (opts.subscribe.size() > 0) {
      reader = std::make_unique<NanomsgReader>(opts.subscribe);
    } else {
      reader = std::make_unique<FileReader>(opts.paths);
    }

    // Run in verbose mode when stdout is a TTY.
    bool verbose = isatty(fileno(stdout));
    p.run(reader, verbose);
  }

  if (opts.mode == ProcessMode::LRIT) {
    LRITProcessor p(std::move(handlers));
    p.run(argc, argv);
  }
}